

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O2

void __thiscall agge::tests::DashTests::ThePatternIsAppliedPeriodically(DashTests *this)

{
  long lVar1;
  undefined1 *puVar2;
  point *ppVar3;
  byte bVar4;
  point pVar5;
  allocator local_1f9;
  undefined1 local_1f8 [32];
  int local_1d8;
  point local_1d4;
  point local_1c8 [2];
  dash d;
  point local_158;
  undefined8 local_14c;
  int local_144;
  undefined8 local_140;
  int local_138;
  undefined8 local_134;
  int local_12c;
  undefined8 local_128;
  int local_120;
  undefined8 local_11c;
  int local_114;
  undefined8 local_110;
  int local_108;
  point reference2 [5];
  string local_b0;
  LocationInfo local_90;
  point reference1 [7];
  
  bVar4 = 0;
  dash::dash(&d);
  dash::add_dash(&d,5.0,10.0);
  move_to<agge::dash>(&d,0.0,0.0);
  dash::add_vertex(&d,44.99,0.0,2);
  pVar5 = vertex<agge::dash>(&d);
  local_158.command = pVar5.command;
  local_158._0_8_ = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_144 = pVar5.command;
  local_14c = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_138 = pVar5.command;
  local_140 = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_12c = pVar5.command;
  local_134 = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_120 = pVar5.command;
  local_128 = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_114 = pVar5.command;
  local_11c = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_108 = pVar5.command;
  local_110 = pVar5._0_8_;
  puVar2 = &DAT_001a5960;
  ppVar3 = reference1;
  for (lVar1 = 0x54; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined1 *)&ppVar3->x = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    ppVar3 = (point *)((long)ppVar3 + (ulong)bVar4 * -2 + 1);
  }
  std::__cxx11::string::string
            ((string *)reference2,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,(allocator *)&local_90);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1f8,(string *)reference2,0x8c);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,7ul>
            (&reference1,(point (*) [7])&local_158,(LocationInfo *)local_1f8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  dash::remove_all_dashes(&d);
  dash::add_dash(&d,5.0,7.0);
  dash::remove_all(&d);
  move_to<agge::dash>(&d,0.0,0.0);
  dash::add_vertex(&d,24.0,0.0,2);
  pVar5 = vertex<agge::dash>(&d);
  local_1f8._8_4_ = pVar5.command;
  local_1f8._0_8_ = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_1f8._20_4_ = pVar5.command;
  local_1f8._12_8_ = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_1d8 = pVar5.command;
  local_1f8._24_8_ = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_1d4.command = pVar5.command;
  local_1d4._0_8_ = pVar5._0_8_;
  pVar5 = vertex<agge::dash>(&d);
  local_1c8[0].command = pVar5.command;
  local_1c8[0]._0_8_ = pVar5._0_8_;
  reference2[4].x = 0.0;
  reference2[4].y = 0.0;
  reference2[4].command = 0;
  reference2[2].command = 1;
  reference2[3].x = 17.0;
  reference2[3].y = 0.0;
  reference2[3].command = 2;
  reference2[1].y = 0.0;
  reference2[1].command = 2;
  reference2[2].x = 12.0;
  reference2[2].y = 0.0;
  reference2[0].x = 0.0;
  reference2[0].y = 0.0;
  reference2[0].command = 1;
  reference2[1].x = 5.0;
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_1f9);
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0xa5);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,5ul>
            (&reference2,(point (*) [5])local_1f8,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  dash::~dash(&d);
  return;
}

Assistant:

test( ThePatternIsAppliedPeriodically )
			{
				// INIT
				dash d;

				d.add_dash(5.0f, 10.0f);

				// ACT
				move_to(d, 0.0f, 0.0f);
				line_to(d, 44.99f, 0.0f);
				mocks::path::point result1[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 15.0f, 0.0f, path_command_move_to },
					{ 20.0f, 0.0f, path_command_line_to },
					{ 30.0f, 0.0f, path_command_move_to },
					{ 35.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// INIT
				d.remove_all_dashes();
				d.add_dash(5.0f, 7.0f);
				d.remove_all();

				// ACT (pattern end coincides with segment end)
				move_to(d, 0.0f, 0.0f);
				line_to(d, 24.0f, 0.0f);
				mocks::path::point result2[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 12.0f, 0.0f, path_command_move_to },
					{ 17.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}